

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_class.c
# Opt level: O3

_class * class_new(t_symbol *s,t_newmethod newmethod,t_method freemethod,size_t size,int flags,
                  t_atomtype type1,...)

{
  t_atomtype tVar1;
  char *__s;
  char *__s_00;
  t_pd c;
  t_symbol *sel;
  char in_AL;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  _class *p_Var5;
  t_methodentry *ptVar6;
  t_gotfn *pp_Var7;
  _widgetbehavior *p_Var8;
  code *pcVar9;
  long lVar10;
  uint uVar11;
  t_atomtype *ptVar12;
  ulong uVar13;
  t_atomtype *ptVar14;
  bool bVar15;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  t_atomtype vec [6];
  t_atomtype local_e8 [12];
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  ptVar12 = (t_atomtype *)&stack0x00000008;
  vec[0] = type1;
  if (type1 != A_NULL) {
    ap[0].gp_offset = 0x30;
    lVar10 = 1;
    do {
      if ((int)lVar10 == 6) {
        if (s == (t_symbol *)0x0) {
          pd_error((void *)0x0,"unnamed class: sorry: only %d args typechecked; use A_GIMME",5);
        }
        else {
          pd_error((void *)0x0,"class %s: sorry: only %d args typechecked; use A_GIMME",s->s_name,5)
          ;
        }
        break;
      }
      if (ap[0].gp_offset < 0x29) {
        uVar13 = (ulong)ap[0].gp_offset;
        ap[0].gp_offset = ap[0].gp_offset + 8;
        ptVar14 = (t_atomtype *)((long)local_e8 + uVar13);
      }
      else {
        ptVar14 = ptVar12;
        ptVar12 = ptVar12 + 2;
      }
      tVar1 = *ptVar14;
      vec[lVar10] = tVar1;
      lVar10 = lVar10 + 1;
    } while (tVar1 != A_NULL);
  }
  if (newmethod != (t_newmethod)0x0 && pd_objectmaker != (t_pd)0x0) {
    class_addmethod(pd_objectmaker,(t_method)newmethod,s,type1,(ulong)vec[1],(ulong)vec[2],
                    (ulong)vec[3],(ulong)vec[4],(ulong)vec[5]);
    sel = class_loadsym;
    c = pd_objectmaker;
    if (class_loadsym != (t_symbol *)0x0 && s != (t_symbol *)0x0) {
      iVar2 = pd_objectmaker->c_nmethod;
      if (iVar2 != 0) {
        pp_Var7 = &pd_objectmaker->c_methods->me_fun;
        do {
          if (((t_methodentry *)(pp_Var7 + -1))->me_name == class_loadsym) {
            if (*pp_Var7 != (t_gotfn)0x0) goto LAB_0016be5a;
            break;
          }
          pp_Var7 = pp_Var7 + 3;
          iVar2 = iVar2 + -1;
        } while (iVar2 != 0);
      }
      __s = class_loadsym->s_name;
      __s_00 = s->s_name;
      sVar3 = strlen(__s_00);
      sVar4 = strlen(__s);
      if ((sVar3 <= sVar4 && sVar4 - sVar3 != 0) &&
         (iVar2 = strcmp(__s_00,__s + (sVar4 - sVar3)), iVar2 == 0)) {
        class_addmethod(c,(t_method)newmethod,sel,type1,(ulong)vec[1],(ulong)vec[2],(ulong)vec[3],
                        (ulong)vec[4],(ulong)vec[5]);
      }
    }
  }
LAB_0016be5a:
  uVar11 = 3;
  if ((flags & 3U) != 0) {
    uVar11 = flags & 3U;
  }
  p_Var5 = (_class *)getbytes(0xa0);
  p_Var5->c_helpname = s;
  p_Var5->c_name = s;
  p_Var5->c_size = size;
  p_Var5->c_nmethod = 0;
  p_Var5->c_freemethod = freemethod;
  p_Var5->c_bangmethod = pd_defaultbang;
  p_Var5->c_pointermethod = pd_defaultpointer;
  p_Var5->c_floatmethod = pd_defaultfloat;
  p_Var5->c_symbolmethod = pd_defaultsymbol;
  p_Var5->c_listmethod = pd_defaultlist;
  p_Var5->c_anymethod = pd_defaultanything;
  p_Var5->c_firstin = (flags & 8U) == 0;
  p_Var5->c_gobj = 1 < uVar11;
  bVar15 = uVar11 == 3;
  p_Var8 = &text_widgetbehavior;
  if (!bVar15) {
    p_Var8 = (_widgetbehavior *)0x0;
  }
  p_Var5->c_wb = p_Var8;
  p_Var5->c_pwb = (_parentwidgetbehavior *)0x0;
  p_Var5->c_patchable = bVar15;
  p_Var5->c_drawcommand = '\0';
  p_Var5->c_floatsignalin = 0;
  pcVar9 = class_nosavefn;
  if (bVar15) {
    pcVar9 = text_save;
  }
  p_Var5->c_externdir = class_extern_dir;
  p_Var5->c_savefn = pcVar9;
  p_Var5->c_classfreefn = (t_classfreefn)0x0;
  ptVar6 = (t_methodentry *)getbytes(0);
  p_Var5->c_methods = ptVar6;
  return p_Var5;
}

Assistant:

t_class *class_new(t_symbol *s, t_newmethod newmethod, t_method freemethod,
    size_t size, int flags, t_atomtype type1, ...)
{
    va_list ap;
    t_atomtype vec[MAXPDARG+1], *vp = vec;
    int count = 0, i;
    t_class *c;
    int typeflag = flags & CLASS_TYPEMASK;
    if (!typeflag) typeflag = CLASS_PATCHABLE;
    *vp = type1;

    va_start(ap, type1);
    while (*vp)
    {
        if (count == MAXPDARG)
        {
            if (s)
                pd_error(0, "class %s: sorry: only %d args typechecked; use A_GIMME",
                      s->s_name, MAXPDARG);
            else
                pd_error(0, "unnamed class: sorry: only %d args typechecked; use A_GIMME",
                      MAXPDARG);
            break;
        }
        vp++;
        count++;
        *vp = va_arg(ap, t_atomtype);
    }
    va_end(ap);

    if (pd_objectmaker && newmethod)
    {
            /* add a "new" method by the name specified by the object */
        class_addmethod(pd_objectmaker, (t_method)newmethod, s,
            vec[0], vec[1], vec[2], vec[3], vec[4], vec[5]);
        if (s && class_loadsym && !zgetfn(&pd_objectmaker, class_loadsym))
        {
                /* if we're loading an extern it might have been invoked by a
                longer file name; in this case, make this an admissible name
                too. */
            const char *loadstring = class_loadsym->s_name;
            size_t l1 = strlen(s->s_name), l2 = strlen(loadstring);
            if (l2 > l1 && !strcmp(s->s_name, loadstring + (l2 - l1)))
                class_addmethod(pd_objectmaker, (t_method)newmethod,
                    class_loadsym,
                    vec[0], vec[1], vec[2], vec[3], vec[4], vec[5]);
        }
    }
    c = (t_class *)t_getbytes(sizeof(*c));
    c->c_name = c->c_helpname = s;
    c->c_size = size;
    c->c_nmethod = 0;
    c->c_freemethod = (t_method)freemethod;
    c->c_bangmethod = pd_defaultbang;
    c->c_pointermethod = pd_defaultpointer;
    c->c_floatmethod = pd_defaultfloat;
    c->c_symbolmethod = pd_defaultsymbol;
    c->c_listmethod = pd_defaultlist;
    c->c_anymethod = pd_defaultanything;
    c->c_wb = (typeflag == CLASS_PATCHABLE ? &text_widgetbehavior : 0);
    c->c_pwb = 0;
    c->c_firstin = ((flags & CLASS_NOINLET) == 0);
    c->c_patchable = (typeflag == CLASS_PATCHABLE);
    c->c_gobj = (typeflag >= CLASS_GOBJ);
    c->c_drawcommand = 0;
    c->c_floatsignalin = 0;
    c->c_externdir = class_extern_dir;
    c->c_savefn = (typeflag == CLASS_PATCHABLE ? text_save : class_nosavefn);
    c->c_classfreefn = 0;
#ifdef PDINSTANCE
    c->c_methods = (t_methodentry **)t_getbytes(
        pd_ninstances * sizeof(*c->c_methods));
    for (i = 0; i < pd_ninstances; i++)
        c->c_methods[i] = t_getbytes(0);
    c->c_next = class_list;
    class_list = c;
#else
    c->c_methods = t_getbytes(0);
#endif
#if 0       /* enable this if you want to see a list of all classes */
    post("class: %s", c->c_name->s_name);
#endif
    return (c);
}